

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O0

void __thiscall ipx::BasicLu::_SolveDense(BasicLu *this,Vector *rhs,Vector *lhs,char trans)

{
  lu_int lVar1;
  logic_error *this_00;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  Int status;
  double *in_stack_00000220;
  lu_int *in_stack_00000228;
  double *in_stack_00000230;
  lu_int *in_stack_00000238;
  double *in_stack_00000240;
  lu_int *in_stack_00000248;
  lu_int *in_stack_00000260;
  double *in_stack_00000268;
  double *in_stack_00000270;
  double *in_stack_00000278;
  char in_stack_00000280;
  
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x80926f);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x809282);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809295);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x8092ab);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x8092be);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x8092d4);
  std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x8092e7);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x8092fb);
  std::valarray<double>::operator[](in_RSI,0);
  std::valarray<double>::operator[](in_RDX,0);
  lVar1 = basiclu_solve_dense(in_stack_00000248,in_stack_00000240,in_stack_00000238,
                              in_stack_00000230,in_stack_00000228,in_stack_00000220,
                              in_stack_00000260,in_stack_00000268,in_stack_00000270,
                              in_stack_00000278,in_stack_00000280);
  if (lVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"basiclu_solve_dense failed");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void BasicLu::_SolveDense(const Vector& rhs, Vector& lhs, char trans) {
    Int status = basiclu_solve_dense(istore_.data(), xstore_.data(),
                                     Li_.data(), Lx_.data(),
                                     Ui_.data(), Ux_.data(),
                                     Wi_.data(), Wx_.data(),
                                     &rhs[0], &lhs[0], trans);
    if (status != BASICLU_OK)
        throw std::logic_error("basiclu_solve_dense failed");
}